

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  u8 *puVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  MemPage *pPage;
  MemPage *local_38;
  
  if (pBt->nPage < pgno) {
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xde4a,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    return 0xb;
  }
  uVar7 = 0;
  iVar5 = getAndInitPage(pBt,pgno,&local_38,0);
  if (iVar5 != 0) {
    return iVar5;
  }
  if (local_38->nCell != 0) {
    uVar6 = 0;
    do {
      uVar3 = local_38->maskPage;
      uVar1 = local_38->aCellIdx[uVar6 * 2];
      uVar2 = local_38->aCellIdx[uVar6 * 2 + 1];
      puVar4 = local_38->aData;
      if (local_38->leaf == '\0') {
        uVar7 = *(uint *)(puVar4 + (CONCAT11(uVar1,uVar2) & uVar3));
        iVar5 = clearDatabasePage(pBt,uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18,1,pnChange);
        if (iVar5 != 0) goto LAB_00145739;
      }
      iVar5 = clearCell(local_38,puVar4 + (CONCAT11(uVar1,uVar2) & uVar3));
      if (iVar5 != 0) goto LAB_00145739;
      uVar6 = uVar6 + 1;
      uVar7 = (uint)local_38->nCell;
    } while (uVar6 < local_38->nCell);
  }
  if (local_38->leaf == '\0') {
    uVar7 = *(uint *)(local_38->aData + 8);
    iVar5 = clearDatabasePage(pBt,uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                  uVar7 << 0x18,1,pnChange);
    if (iVar5 != 0) goto LAB_00145739;
  }
  else if (pnChange != (int *)0x0) {
    *pnChange = *pnChange + uVar7;
  }
  if (freePageFlag == 0) {
    iVar5 = sqlite3PagerWrite(local_38->pDbPage);
    if (iVar5 == 0) {
      zeroPage(local_38,*local_38->aData | 8);
      iVar5 = 0;
    }
  }
  else {
    iVar5 = freePage2(local_38->pBt,local_38,local_38->pgno);
  }
LAB_00145739:
  sqlite3PagerUnref(local_38->pDbPage);
  return iVar5;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }

  rc = getAndInitPage(pBt, pgno, &pPage, 0);
  if( rc ) return rc;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[0] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}